

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_mame.c
# Opt level: O1

void saa1099m_write(void *info,UINT8 offset,UINT8 data)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  if ((offset & 1) == 0) {
    bVar1 = *(byte *)((long)info + 0x18);
    if (bVar1 < 0x1d) {
      uVar2 = (uint)bVar1;
      switch(bVar1) {
      case 0:
      case 1:
      case 2:
      case 3:
      case 4:
      case 5:
        *(INT32 *)((long)info + (ulong)(bVar1 & 7) * 0x28 + 0x24) = amplitude_lookup[data & 0xf];
        *(INT32 *)((long)info + (ulong)(bVar1 & 7) * 0x28 + 0x28) = amplitude_lookup[data >> 4];
        break;
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
        *(UINT8 *)((long)info + (ulong)(uVar2 & 7) * 0x28 + 0x20) = data;
        break;
      case 0x10:
      case 0x11:
      case 0x12:
        uVar2 = uVar2 * 2 & 6;
        *(byte *)((long)info + (ulong)uVar2 * 0x28 + 0x23) = data & 7;
        *(byte *)((long)info + (ulong)(uVar2 + 1) * 0x28 + 0x23) = data >> 4 & 7;
        break;
      case 0x14:
        *(byte *)((long)info + 0x21) = data & 1;
        *(byte *)((long)info + 0x49) = data & 2;
        *(byte *)((long)info + 0x71) = data & 4;
        *(byte *)((long)info + 0x99) = data & 8;
        *(byte *)((long)info + 0xc1) = data & 0x10;
        *(byte *)((long)info + 0xe9) = data & 0x20;
        break;
      case 0x15:
        *(byte *)((long)info + 0x22) = data & 1;
        *(byte *)((long)info + 0x4a) = data & 2;
        *(byte *)((long)info + 0x72) = data & 4;
        *(byte *)((long)info + 0x9a) = data & 8;
        *(byte *)((long)info + 0xc2) = data & 0x10;
        *(byte *)((long)info + 0xea) = data & 0x20;
        break;
      case 0x16:
        *(byte *)((long)info + 8) = data & 3;
        *(byte *)((long)info + 9) = data >> 4 & 3;
        break;
      case 0x18:
      case 0x19:
        uVar3 = (ulong)(uVar2 & 1);
        *(byte *)((long)info + uVar3 + 0xc) = data & 1;
        *(byte *)((long)info + uVar3 + 0xe) = data >> 1 & 7;
        *(byte *)((long)info + uVar3 + 0x10) = data & 0x10;
        *(byte *)((long)info + uVar3 + 0x12) = data & 0x20;
        *(byte *)((long)info + uVar3 + 10) = data & 0x80;
        *(undefined1 *)((long)info + uVar3 + 0x14) = 0;
        break;
      case 0x1c:
        *(byte *)((long)info + 0x16) = data & 1;
        *(byte *)((long)info + 0x17) = data & 2;
        if ((data & 2) != 0) {
          lVar4 = 0;
          do {
            *(undefined1 *)((long)info + lVar4 + 0x40) = 0;
            *(undefined8 *)((long)info + lVar4 + 0x30) = 0;
            lVar4 = lVar4 + 0x28;
          } while (lVar4 != 0xf0);
        }
      }
    }
  }
  else {
    *(byte *)((long)info + 0x18) = data & 0x1f;
    if ((data & 0x1e) == 0x18) {
      if (*(char *)((long)info + 0x12) != '\0') {
        saa1099_envelope_w((saa1099_state *)info,0);
      }
      if (*(char *)((long)info + 0x13) != '\0') {
        saa1099_envelope_w((saa1099_state *)info,1);
        return;
      }
    }
  }
  return;
}

Assistant:

static void saa1099m_write(void *info, UINT8 offset, UINT8 data)
{
	if (offset & 1)
		saa1099_control_w(info, data);
	else
		saa1099_data_w(info, data);
}